

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipkincore_types.cpp
# Opt level: O0

void __thiscall twitter::zipkin::thrift::Annotation::printTo(Annotation *this,ostream *out)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  string local_88;
  string local_68;
  string local_38;
  ostream *local_18;
  ostream *out_local;
  Annotation *this_local;
  
  local_18 = out;
  out_local = (ostream *)this;
  std::operator<<(out,"Annotation(");
  poVar1 = std::operator<<(local_18,"timestamp=");
  apache::thrift::to_string<long>(&local_38,&this->timestamp);
  std::operator<<(poVar1,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  poVar1 = std::operator<<(local_18,", ");
  poVar1 = std::operator<<(poVar1,"value=");
  apache::thrift::to_string<std::__cxx11::string>(&local_68,(thrift *)&this->value,t);
  std::operator<<(poVar1,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  poVar1 = std::operator<<(local_18,", ");
  std::operator<<(poVar1,"host=");
  poVar1 = local_18;
  if (((byte)this->__isset >> 2 & 1) == 0) {
    std::operator<<(local_18,"<null>");
  }
  else {
    apache::thrift::to_string<twitter::zipkin::thrift::Endpoint>(&local_88,&this->host);
    std::operator<<(poVar1,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
  }
  std::operator<<(local_18,")");
  return;
}

Assistant:

void Annotation::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "Annotation(";
  out << "timestamp=" << to_string(timestamp);
  out << ", " << "value=" << to_string(value);
  out << ", " << "host="; (__isset.host ? (out << to_string(host)) : (out << "<null>"));
  out << ")";
}